

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O0

void __thiscall CEPlanet::Update_JPL(CEPlanet *this,double new_jd)

{
  reference pvVar1;
  CEPlanet *in_RDI;
  double *in_XMM0_Qa;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double obl;
  double z_ecl;
  double y_ecl;
  double x_ecl;
  double y_prime;
  double x_prime;
  double del_E;
  double E;
  double M;
  double W;
  double O;
  double w;
  double L;
  double I;
  double e;
  double a;
  double T;
  double tdb2;
  double tdb1;
  double mjd;
  double *in_stack_fffffffffffffde8;
  double *in_stack_fffffffffffffe18;
  double *in_stack_fffffffffffffe20;
  double *in_stack_fffffffffffffe28;
  CEPlanet *in_stack_fffffffffffffe30;
  CEPlanet *in_stack_fffffffffffffe38;
  double local_28;
  double local_20;
  
  CEDate::GetMJD2JDFactor();
  CEDate::UTC2TDB(in_XMM0_Qa,in_stack_fffffffffffffde8,(double *)0x13fd6f);
  dVar2 = CppEphem::julian_date_J2000();
  dVar2 = ((local_20 + local_28) - dVar2) / 36525.0;
  dVar3 = ComputeElement(in_RDI,in_RDI->semi_major_axis_au_,in_RDI->semi_major_axis_au_per_cent_,
                         dVar2);
  dVar4 = ComputeElement(in_RDI,in_RDI->eccentricity_,in_RDI->eccentricity_per_cent_,dVar2);
  dVar5 = ComputeElement(in_RDI,in_RDI->inclination_deg_,in_RDI->inclination_deg_per_cent_,dVar2);
  ComputeElement(in_RDI,in_RDI->mean_longitude_deg_,in_RDI->mean_longitude_deg_per_cent_,dVar2);
  dVar6 = ComputeElement(in_RDI,in_RDI->perihelion_lon_deg_,in_RDI->perihelion_long_deg_per_cent_,
                         dVar2);
  dVar2 = ComputeElement(in_RDI,in_RDI->ascending_node_lon_deg_,
                         in_RDI->ascending_node_lon_deg_per_cent_,dVar2);
  dVar6 = dVar6 - dVar2;
  dVar7 = MeanAnomaly(in_stack_fffffffffffffe30,(double)in_stack_fffffffffffffe28,
                      (double)in_stack_fffffffffffffe20,(double)in_stack_fffffffffffffe18);
  sin(dVar7 * 0.017453292519943295);
  dVar7 = EccentricAnomoly(in_stack_fffffffffffffe38,(double *)in_stack_fffffffffffffe30,
                           in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                           in_stack_fffffffffffffe18);
  dVar8 = cos(dVar7 * 0.017453292519943295);
  dVar8 = dVar3 * (dVar8 - dVar4);
  dVar4 = sqrt(-dVar4 * dVar4 + 1.0);
  dVar3 = dVar3 * dVar4;
  dVar4 = sin(dVar7 * 0.017453292519943295);
  dVar3 = dVar3 * dVar4;
  dVar4 = cos(dVar6 * 0.017453292519943295);
  dVar7 = cos(dVar2 * 0.017453292519943295);
  dVar9 = sin(dVar6 * 0.017453292519943295);
  dVar10 = sin(dVar2 * 0.017453292519943295);
  dVar9 = dVar9 * dVar10;
  dVar10 = cos(dVar5 * 0.017453292519943295);
  dVar11 = sin(dVar6 * 0.017453292519943295);
  dVar12 = cos(dVar2 * 0.017453292519943295);
  dVar13 = cos(dVar6 * 0.017453292519943295);
  dVar14 = sin(dVar2 * 0.017453292519943295);
  dVar15 = cos(dVar5 * 0.017453292519943295);
  dVar16 = cos(dVar6 * 0.017453292519943295);
  dVar17 = sin(dVar2 * 0.017453292519943295);
  dVar18 = sin(dVar6 * 0.017453292519943295);
  dVar19 = cos(dVar2 * 0.017453292519943295);
  dVar20 = cos(dVar5 * 0.017453292519943295);
  dVar21 = sin(dVar6 * 0.017453292519943295);
  dVar22 = sin(dVar2 * 0.017453292519943295);
  dVar23 = cos(dVar6 * 0.017453292519943295);
  dVar2 = cos(dVar2 * 0.017453292519943295);
  dVar24 = cos(dVar5 * 0.017453292519943295);
  dVar2 = dVar8 * (dVar16 * dVar17 + dVar18 * dVar19 * dVar20) +
          dVar3 * (-dVar21 * dVar22 + dVar23 * dVar2 * dVar24);
  dVar16 = sin(dVar6 * 0.017453292519943295);
  dVar17 = sin(dVar5 * 0.017453292519943295);
  dVar6 = cos(dVar6 * 0.017453292519943295);
  dVar5 = sin(dVar5 * 0.017453292519943295);
  dVar5 = dVar8 * dVar16 * dVar17 + dVar3 * dVar6 * dVar5;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->pos_icrs_,0);
  *pvVar1 = dVar8 * (dVar4 * dVar7 + -(dVar9 * dVar10)) +
            dVar3 * (-dVar11 * dVar12 + -(dVar13 * dVar14 * dVar15));
  dVar4 = cos(0.4090926102968565);
  dVar6 = sin(0.4090926102968565);
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->pos_icrs_,1);
  *pvVar1 = dVar2 * dVar4 + -(dVar5 * dVar6);
  dVar4 = sin(0.4090926102968565);
  dVar6 = cos(0.4090926102968565);
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->pos_icrs_,2);
  *pvVar1 = dVar2 * dVar4 + dVar5 * dVar6;
  return;
}

Assistant:

void CEPlanet::Update_JPL(double new_jd) const
{
    /* Date has changed, so we need to recompute the coordinates of this object */

    // Compute the number of centuries since J2000 epoch
    double mjd = new_jd - CEDate::GetMJD2JDFactor();
    double tdb1;
    double tdb2;
    CEDate::UTC2TDB(mjd, &tdb1, &tdb2);
    double T = (tdb1+tdb2 - CppEphem::julian_date_J2000()) / DJC;

    // Compute the values
    double a = ComputeElement(semi_major_axis_au_, semi_major_axis_au_per_cent_, T) ;
    double e = ComputeElement(eccentricity_, eccentricity_per_cent_, T) ;
    double I = ComputeElement(inclination_deg_, inclination_deg_per_cent_, T) ;
    double L = ComputeElement(mean_longitude_deg_, mean_longitude_deg_per_cent_, T) ;
    double w = ComputeElement(perihelion_lon_deg_, perihelion_long_deg_per_cent_, T) ;
    double O = ComputeElement(ascending_node_lon_deg_, ascending_node_lon_deg_per_cent_, T) ;
    
    // Compute the argument of perihelion (W) and mean anomoly (M)
    double W = w - O ;
    double M = MeanAnomaly(L, w, T) ;
    
    // Iterate on the eccentric anomoly
    double E = M + e*DR2D * std::sin(M*DD2R) ;
    double del_E(0.0) ;
    E = EccentricAnomoly(M, e, E, del_E) ;
    
    // Compute the planets heliocentric coordinates in it's orbital plane
    double x_prime = a * (std::cos(E*DD2R) - e) ;
    double y_prime = a * std::sqrt(1.0 - (e*e)) * std::sin(E*DD2R) ;
//    double z_prime = 0.0 ;  // by definition
    
    // Transform the coordinates into the coordinates of the ecliptic
    double x_ecl = x_prime * (std::cos(W*DD2R)*std::cos(O*DD2R) - std::sin(W*DD2R)*std::sin(O*DD2R)*std::cos(I*DD2R)) +
                   y_prime * (-std::sin(W*DD2R)*std::cos(O*DD2R) - std::cos(W*DD2R)*std::sin(O*DD2R)*std::cos(I*DD2R)) ;
    double y_ecl = x_prime * (std::cos(W*DD2R)*std::sin(O*DD2R) + std::sin(W*DD2R)*std::cos(O*DD2R)*std::cos(I*DD2R)) +
                   y_prime * (-std::sin(W*DD2R)*std::sin(O*DD2R) + std::cos(W*DD2R)*std::cos(O*DD2R)*std::cos(I*DD2R)) ;
    double z_ecl = x_prime * (std::sin(W*DD2R)*std::sin(I*DD2R)) + y_prime * (std::cos(W*DD2R)*std::sin(I*DD2R)) ;
    
    // Convert from the ecliptic coordinates to ICRS
    double obl = DD2R * 23.43928 ;
    pos_icrs_[0] = x_ecl ;
    pos_icrs_[1] = y_ecl * std::cos(obl) - z_ecl * std::sin(obl) ;
    pos_icrs_[2] = y_ecl * std::sin(obl) + z_ecl * std::cos(obl) ;
}